

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blitter_terminal.cpp
# Opt level: O3

void __thiscall E64::blitter_ic::terminal_putsymbol(blitter_ic *this,uint8_t number,char symbol)

{
  char *pcVar1;
  blit_t *pbVar2;
  long lVar3;
  ushort uVar4;
  int iVar5;
  undefined7 in_register_00000031;
  uint uVar6;
  
  iVar5 = (int)CONCAT71(in_register_00000031,number);
  lVar3 = (ulong)(uint)(iVar5 << 6) * 5;
  uVar6 = iVar5 * 0x2000;
  this->tile_ram[uVar6 + *(ushort *)(this->blit->command_buffer + lVar3 + -0xd) & 0x1fffff] =
       this->blit->command_buffer[lVar3 + -1] << 7 ^ symbol;
  pbVar2 = this->blit;
  *(undefined2 *)
   ((long)this->tile_foreground_color_ram +
   (ulong)*(ushort *)(pbVar2->command_buffer + lVar3 + -0xd) * 2 + (ulong)uVar6) =
       *(undefined2 *)(pbVar2->command_buffer + lVar3 + -0x21);
  *(undefined2 *)
   ((long)this->tile_background_color_ram +
   (ulong)*(ushort *)(pbVar2->command_buffer + lVar3 + -0xd) * 2 + (ulong)uVar6) =
       *(undefined2 *)(pbVar2->command_buffer + lVar3 + -0x1f);
  uVar4 = (short)*(undefined4 *)(pbVar2->command_buffer + lVar3 + -0xd) + 1;
  *(ushort *)(pbVar2->command_buffer + lVar3 + -0xd) = uVar4;
  if (*(ushort *)(pbVar2->command_buffer + lVar3 + -0x3d) <= uVar4) {
    terminal_add_bottom_row(this,number);
    pcVar1 = this->blit->command_buffer + ((ulong)(uint)(iVar5 * 0x140) - 0xd);
    *(ushort *)pcVar1 =
         *(short *)pcVar1 -
         (ushort)(byte)this->blit->command_buffer[(ulong)(uint)(iVar5 * 0x140) - 0x41];
  }
  return;
}

Assistant:

void E64::blitter_ic::terminal_putsymbol(uint8_t number, char symbol)
{
	terminal_putsymbol_at_cursor(number, symbol);
	blit[number].cursor_position++;
	if (blit[number].cursor_position >= blit[number].get_tiles()) {
		terminal_add_bottom_row(number);
		blit[number].cursor_position -= blit[number].get_columns();
	}
}